

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::ArraySpliceHelper<void*>
               (JavascriptArray *pnewArr,JavascriptArray *pArr,uint32 start,uint32 deleteLen,
               Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext)

{
  Type *addr;
  Type TVar1;
  Recycler *recycler;
  Type TVar2;
  code *pcVar3;
  Type *addr_00;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  SparseArraySegment<void_*> *pSVar8;
  SparseArraySegmentBase *pSVar9;
  SparseArraySegmentBase *pSVar10;
  Type TVar11;
  Type *addr_01;
  uint uVar12;
  uint uVar13;
  uint32 uVar14;
  Type *prev;
  Type *local_38;
  
  recycler = scriptContext->recycler;
  if ((pArr->head).ptr == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1c5f,"(pArr->head)","pArr->head");
    if (!bVar4) goto LAB_00ba4633;
    *puVar7 = 0;
  }
  addr = &pArr->head;
  if (addr->ptr == EmptySegment) {
    AllocateHead<void*>(pArr);
  }
  TVar11.ptr = addr->ptr;
  uVar6 = (TVar11.ptr)->left + (TVar11.ptr)->size;
  if (CARRY4((TVar11.ptr)->left,(TVar11.ptr)->size)) {
    uVar6 = 0xffffffff;
  }
  prev = (Type *)addr;
  if (start < uVar6) {
    bVar4 = true;
    pSVar9 = (SparseArraySegmentBase *)0x0;
    local_38 = (Type *)addr;
  }
  else {
    do {
      pSVar9 = TVar11.ptr;
      local_38 = prev;
      TVar11.ptr = (pSVar9->next).ptr;
      if ((TVar11.ptr != (SparseArraySegmentBase *)0x0) &&
         (uVar6 = (TVar11.ptr)->left + (TVar11.ptr)->size,
         CARRY4((TVar11.ptr)->left,(TVar11.ptr)->size))) {
        uVar6 = 0xffffffff;
      }
      prev = (Type *)&pSVar9->next;
      bVar4 = TVar11.ptr != (SparseArraySegmentBase *)0x0;
    } while ((bVar4) && (uVar6 <= start));
  }
  bVar5 = IsInlineSegment(TVar11.ptr,pArr);
  if (bVar4) {
    uVar12 = deleteLen + start;
    uVar6 = (TVar11.ptr)->left;
    if ((uVar6 <= start) && (uVar12 <= (TVar11.ptr)->length + uVar6)) {
      pSVar9 = ((TVar11.ptr)->next).ptr;
      ArraySegmentSpliceHelper<void*>
                (pnewArr,(SparseArraySegment<void_*> *)TVar11.ptr,prev,start,deleteLen,insertArgs,
                 insertLen,recycler);
      if (pSVar9 != (SparseArraySegmentBase *)0x0) {
        do {
          pSVar9->left = pSVar9->left + (insertLen - deleteLen);
          if ((pSVar9->next).ptr == (SparseArraySegmentBase *)0x0) {
            SparseArraySegmentBase::EnsureSizeInBound(pSVar9);
          }
          pSVar9 = (pSVar9->next).ptr;
        } while (pSVar9 != (SparseArraySegmentBase *)0x0);
      }
      if (*(SparseArraySegmentBase **)prev == (SparseArraySegmentBase *)0x0) {
        return;
      }
      SparseArraySegmentBase::EnsureSizeInBound(*(SparseArraySegmentBase **)prev);
      return;
    }
    addr_01 = &pnewArr->head;
    if (uVar6 < start) {
      uVar6 = uVar6 + (TVar11.ptr)->length;
      uVar14 = uVar6 - start;
      if (start <= uVar6 && uVar14 != 0) {
        pSVar8 = SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                           (recycler,0,uVar14,uVar14,(SparseArraySegmentBase *)0x0);
        pSVar9 = &SparseArraySegment<void_*>::CopySegment(recycler,pSVar8,0,TVar11.ptr,start,uVar14)
                  ->super_SparseArraySegmentBase;
        (pSVar9->next).ptr = (SparseArraySegmentBase *)0x0;
        Memory::Recycler::WBSetBit((char *)addr_01);
        addr_01->ptr = pSVar9;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
        SparseArraySegment<void_*>::Truncate((SparseArraySegment<void_*> *)TVar11.ptr,start);
        addr_01 = &pSVar9->next;
      }
      local_38 = prev;
      pSVar9 = TVar11.ptr;
      prev = (Type *)&(TVar11.ptr)->next;
LAB_00ba3ec3:
      TVar11.ptr = ((TVar11.ptr)->next).ptr;
    }
    else if (bVar5) {
      if ((start < uVar6) ||
         (uVar13 = (TVar11.ptr)->length + uVar6, uVar14 = uVar13 - start,
         uVar13 < start || uVar14 == 0)) {
        if ((uVar6 != 0) || ((TVar11.ptr)->length != 0)) goto LAB_00ba4006;
        if ((TVar11.ptr)->size == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1cda,"(startSeg->size != 0)","startSeg->size != 0");
          if (!bVar4) goto LAB_00ba4633;
          *puVar7 = 0;
        }
        pSVar10 = ((TVar11.ptr)->next).ptr;
        Memory::Recycler::WBSetBit((char *)prev);
        *(SparseArraySegmentBase **)prev = pSVar10;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(prev);
      }
      else {
        pSVar8 = SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                           (recycler,0,uVar14,uVar14,(SparseArraySegmentBase *)0x0);
        pSVar10 = &SparseArraySegment<void_*>::CopySegment
                             (recycler,pSVar8,0,TVar11.ptr,start,uVar14)->
                   super_SparseArraySegmentBase;
        Memory::Recycler::WBSetBit((char *)addr_01);
        addr_01->ptr = pSVar10;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
        addr_01 = &pSVar10->next;
        pSVar10 = ((TVar11.ptr)->next).ptr;
        Memory::Recycler::WBSetBit((char *)prev);
        *(SparseArraySegmentBase **)prev = pSVar10;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(prev);
        (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                  (pArr,TVar11.ptr,0);
      }
      goto LAB_00ba3ec3;
    }
LAB_00ba4006:
    bVar4 = TVar11.ptr == (SparseArraySegmentBase *)0x0;
    if (!bVar4) {
      TVar1 = (TVar11.ptr)->left;
      uVar6 = (TVar11.ptr)->length + TVar1;
      addr_00 = addr_01;
      TVar2.ptr = TVar11.ptr;
      while (addr_01 = addr_00, TVar11.ptr = TVar2.ptr, uVar6 <= uVar12) {
        addr_01 = &(TVar2.ptr)->next;
        TVar11.ptr = ((TVar2.ptr)->next).ptr;
        (TVar2.ptr)->left = TVar1 - start;
        ((TVar2.ptr)->next).ptr = (SparseArraySegmentBase *)0x0;
        Memory::Recycler::WBSetBit((char *)addr_00);
        addr_00->ptr = TVar2.ptr;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
        Memory::Recycler::WBSetBit((char *)prev);
        *(SparseArraySegmentBase **)prev = TVar11.ptr;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(prev);
        bVar4 = TVar11.ptr == (SparseArraySegmentBase *)0x0;
        if (bVar4) break;
        TVar1 = (TVar11.ptr)->left;
        addr_00 = addr_01;
        TVar2.ptr = TVar11.ptr;
        uVar6 = (TVar11.ptr)->length + TVar1;
      }
    }
    bVar5 = true;
    if (pSVar9 == (SparseArraySegmentBase *)0x0) {
      if ((bVar4) || ((TVar11.ptr)->left != 0)) {
        if (addr->ptr != TVar11.ptr) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1cf6,"(pArr->head == startSeg)","pArr->head == startSeg");
          if (!bVar5) goto LAB_00ba4633;
          *puVar7 = 0;
        }
        EnsureHeadStartsFromZero<void*>(pArr,recycler);
        pSVar9 = (pArr->head).ptr;
        if ((pSVar9 == (SparseArraySegmentBase *)0x0) || ((pSVar9->next).ptr != TVar11.ptr)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1cf8,"(pArr->head && pArr->head->next == startSeg)",
                                      "pArr->head && pArr->head->next == startSeg");
          if (!bVar5) goto LAB_00ba4633;
          *puVar7 = 0;
        }
        pSVar9 = addr->ptr;
        bVar5 = false;
        local_38 = prev;
        prev = (Type *)&pSVar9->next;
      }
      else {
        pSVar9 = (SparseArraySegmentBase *)0x0;
      }
    }
    if (!bVar4) {
      uVar6 = (TVar11.ptr)->left;
      uVar13 = uVar12 - uVar6;
      if (uVar6 <= uVar12 && uVar13 != 0) {
        pSVar8 = SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                           (recycler,uVar6 - start,uVar13,(SparseArraySegmentBase *)0x0);
        pSVar10 = &SparseArraySegment<void_*>::CopySegment
                             (recycler,pSVar8,(TVar11.ptr)->left - start,TVar11.ptr,
                              (TVar11.ptr)->left,uVar13)->super_SparseArraySegmentBase;
        (pSVar10->next).ptr = (SparseArraySegmentBase *)0x0;
        Memory::Recycler::WBSetBit((char *)addr_01);
        addr_01->ptr = pSVar10;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
        Memory::
        MoveArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                  ((WriteBarrierPtr<void> *)(TVar11.ptr + 1),
                   (WriteBarrierPtr<void> *)(&TVar11.ptr[1].left + (ulong)uVar13 * 2),
                   (ulong)((TVar11.ptr)->length - uVar13));
        (TVar11.ptr)->left = (TVar11.ptr)->left + uVar13;
        (TVar11.ptr)->length = (TVar11.ptr)->length - uVar13;
        SparseArraySegmentBase::CheckLengthvsSize(TVar11.ptr);
        SparseArraySegment<void_*>::Truncate
                  ((SparseArraySegment<void_*> *)TVar11.ptr,
                   (TVar11.ptr)->length + (TVar11.ptr)->left);
        SparseArraySegmentBase::EnsureSizeInBound(TVar11.ptr);
      }
      if (!bVar5 && (TVar11.ptr)->left - deleteLen == -insertLen) {
        if (-insertLen != start) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1d17,"(start + insertLen == 0)","start + insertLen == 0");
          if (!bVar4) goto LAB_00ba4633;
          *puVar7 = 0;
        }
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = TVar11.ptr;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        pSVar9 = (SparseArraySegmentBase *)0x0;
        prev = (Type *)addr;
      }
    }
    if (TVar11.ptr != (SparseArraySegmentBase *)0x0) {
      do {
        (TVar11.ptr)->left = (TVar11.ptr)->left + (insertLen - deleteLen);
        if (((TVar11.ptr)->next).ptr == (SparseArraySegmentBase *)0x0) {
          SparseArraySegmentBase::EnsureSizeInBound(TVar11.ptr);
        }
        TVar11.ptr = ((TVar11.ptr)->next).ptr;
      } while (TVar11.ptr != (SparseArraySegmentBase *)0x0);
    }
  }
  SparseArraySegmentBase::EnsureSizeInBound((pnewArr->head).ptr);
  if (pSVar9 != (SparseArraySegmentBase *)0x0) {
    SparseArraySegmentBase::EnsureSizeInBound(pSVar9);
  }
  if (insertLen == 0) {
    return;
  }
  bVar4 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pArr);
  if ((bVar4) || (bVar4 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pArr), bVar4)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1d34,
                                "(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr))"
                                ,
                                "!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr)"
                               );
    if (!bVar4) goto LAB_00ba4633;
    *puVar7 = 0;
  }
  if (pSVar9 != (SparseArraySegmentBase *)0x0) {
    if (start < pSVar9->left) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1d3a,"(!savePrev || savePrev->left <= start)",
                                  "!savePrev || savePrev->left <= start");
      if (!bVar4) {
LAB_00ba4633:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    uVar12 = start - pSVar9->left;
    uVar6 = pSVar9->size - uVar12;
    if (uVar12 <= pSVar9->size && uVar6 != 0) {
      uVar14 = insertLen - uVar6;
      TVar11.ptr = pSVar9;
      if (uVar6 <= insertLen && uVar14 != 0) {
        bVar4 = IsInlineSegment(pSVar9,pArr);
        pSVar10 = (pSVar9->next).ptr;
        if (pSVar10 == (SparseArraySegmentBase *)0x0) {
          TVar11.ptr = &SparseArraySegment<void_*>::GrowByMin(pSVar9,recycler,uVar14)->
                        super_SparseArraySegmentBase;
        }
        else {
          TVar11.ptr = &SparseArraySegment<void_*>::GrowByMinMax
                                  (pSVar9,recycler,uVar14,
                                   pSVar10->left - (pSVar9->left + pSVar9->size))->
                        super_SparseArraySegmentBase;
        }
        if (bVar4) {
          (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                    (pArr,pSVar9,0);
        }
      }
      Memory::Recycler::WBSetBit((char *)local_38);
      *(SparseArraySegmentBase **)local_38 = TVar11.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_38);
      (TVar11.ptr)->length = (insertLen + start) - (TVar11.ptr)->left;
      SparseArraySegmentBase::CheckLengthvsSize(TVar11.ptr);
      goto LAB_00ba4579;
    }
  }
  TVar11.ptr = &SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                          (recycler,start,insertLen,*(SparseArraySegmentBase **)prev)->
                super_SparseArraySegmentBase;
  TVar2.ptr = *(SparseArraySegmentBase **)prev;
  Memory::Recycler::WBSetBit((char *)&(TVar11.ptr)->next);
  ((TVar11.ptr)->next).ptr = TVar2.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&(TVar11.ptr)->next);
  Memory::Recycler::WBSetBit((char *)prev);
  *(SparseArraySegmentBase **)prev = TVar11.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(prev);
LAB_00ba4579:
  Memory::CopyArray<void*,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            ((void **)(&((SparseArraySegmentBase *)&TVar11.ptr[1].left)->left +
                      (ulong)(start - ((SparseArraySegmentBase *)&(TVar11.ptr)->left)->left) * 2),
             (ulong)insertLen,insertArgs,(ulong)insertLen);
  return;
}

Assistant:

void JavascriptArray::ArraySpliceHelper(JavascriptArray* pnewArr, JavascriptArray* pArr, uint32 start, uint32 deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext)
    {
        // Skip pnewArr->EnsureHead(): we don't use existing segment at all.
        Recycler *recycler  = scriptContext->GetRecycler();

        Field(SparseArraySegmentBase*)* prevSeg  = &pArr->head;        // holds the next pointer of previous
        Field(SparseArraySegmentBase*)* prevPrevSeg  = &pArr->head;    // this holds the previous pointer to prevSeg dirty trick.
        SparseArraySegmentBase* savePrev = nullptr;

        Assert(pArr->head); // We should never have a null head.
        pArr->EnsureHead<T>();
        SparseArraySegment<T>* startSeg = SparseArraySegment<T>::From(pArr->head);

        const uint32 limit = start + deleteLen;
        uint32 rightLimit;
        if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
        {
            rightLimit = JavascriptArray::MaxArrayLength;
        }

        // Find out the segment to start delete
        while (startSeg && (rightLimit <= start))
        {
            savePrev = startSeg;
            prevPrevSeg = prevSeg;
            prevSeg = &startSeg->next;
            startSeg = SparseArraySegment<T>::From(startSeg->next);

            if (startSeg)
            {
                if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
                {
                    rightLimit = JavascriptArray::MaxArrayLength;
                }
            }
        }

        bool hasInlineSegment = JavascriptArray::IsInlineSegment(startSeg, pArr);
        if (startSeg)
        {
            // Delete Phase
            if (startSeg->left <= start && (startSeg->left + startSeg->length) >= limit)
            {
                // All splice happens in one segment.
                SparseArraySegmentBase *nextSeg = startSeg->next;
                // Splice the segment first, which might OOM throw but the array would be intact.
                JavascriptArray::ArraySegmentSpliceHelper(
                    pnewArr, startSeg, SparseArraySegment<T>::AddressFrom(prevSeg),
                    start, deleteLen, insertArgs, insertLen, recycler);
                while (nextSeg)
                {
                    // adjust next segments left
                    nextSeg->left = nextSeg->left - deleteLen + insertLen;
                    if (nextSeg->next == nullptr)
                    {
                        nextSeg->EnsureSizeInBound();
                    }
                    nextSeg = nextSeg->next;
                }
                if (*prevSeg)
                {
                    (*prevSeg)->EnsureSizeInBound();
                }
                return;
            }
            else
            {
                SparseArraySegment<T>* newHeadSeg = nullptr; // pnewArr->head is null
                Field(SparseArraySegmentBase*)* prevNewHeadSeg = &pnewArr->head;

                // delete till deleteLen and reuse segments for new array if it is possible.
                // 3 steps -
                //1. delete 1st segment (which may be partial delete)
                // 2. delete next n complete segments
                // 3. delete last segment (which again may be partial delete)

                // Step (1)  -- WOOB 1116297: When left >= start, step (1) is skipped, resulting in pNewArr->head->left != 0. We need to touch up pNewArr.
                if (startSeg->left < start)
                {
                    if (start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;

                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        newHeadSeg->next = nullptr;
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;
                        startSeg->Truncate(start);
                    }
                    savePrev = startSeg;
                    prevPrevSeg = prevSeg;
                    prevSeg = &startSeg->next;
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }

                // Step (2) first we should do a hard copy if we have an inline head Segment
                else if (hasInlineSegment && nullptr != startSeg)
                {
                    // start should be in between left and left + length
                    if (startSeg->left  <= start && start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;
                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;

                        // Remove the entire segment from the original array
                        *prevSeg = startSeg->next;
                        pArr->ClearElements(startSeg, 0);
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                    // if we have an inline head segment with 0 elements, remove it
                    else if (startSeg->left == 0 && startSeg->length == 0)
                    {
                        Assert(startSeg->size != 0);
                        *prevSeg = startSeg->next;
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                }
                // Step (2) proper
                SparseArraySegmentBase *temp = nullptr;
                while (startSeg && (startSeg->left + startSeg->length) <= limit)
                {
                    temp = startSeg->next;

                    // move that entire segment to new array
                    startSeg->left = startSeg->left - start;
                    startSeg->next = nullptr;
                    *prevNewHeadSeg = startSeg;
                    prevNewHeadSeg = &startSeg->next;

                    // Remove the entire segment from the original array
                    *prevSeg = temp;
                    startSeg = (SparseArraySegment<T>*)temp;
                }

                // Step(2) above could delete the original head segment entirely, causing current head not
                // starting from 0. Then if any of the following throw, we have a corrupted array. Need
                // protection here.
                bool dummyHeadNodeInserted = false;
                if (!savePrev && (!startSeg || startSeg->left != 0))
                {
                    Assert(pArr->head == startSeg);
                    pArr->EnsureHeadStartsFromZero<T>(recycler);
                    Assert(pArr->head && pArr->head->next == startSeg);

                    savePrev = pArr->head;
                    prevPrevSeg = prevSeg;
                    prevSeg = &pArr->head->next;
                    dummyHeadNodeInserted = true;
                }

                // Step (3)
                if (startSeg && (startSeg->left < limit))
                {
                    // copy the first part of the last segment to be deleted to new array
                    uint32 headDeleteLen = start + deleteLen - startSeg->left ;

                    newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, startSeg->left -  start, headDeleteLen, (SparseArraySegmentBase *)nullptr);
                    newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, startSeg->left -  start, startSeg, startSeg->left, headDeleteLen);
                    newHeadSeg->next = nullptr;
                    *prevNewHeadSeg = newHeadSeg;
                    prevNewHeadSeg = &newHeadSeg->next;

                    // move the last segment
                    MoveArray(startSeg->elements, startSeg->elements + headDeleteLen, startSeg->length - headDeleteLen);
                    startSeg->left = startSeg->left + headDeleteLen; // We are moving the left ahead to point to the right index
                    startSeg->length = startSeg->length - headDeleteLen;
                    startSeg->CheckLengthvsSize();
                    startSeg->Truncate(startSeg->left + startSeg->length);
                    startSeg->EnsureSizeInBound(); // Just truncated, size might exceed next.left
                }

                if (startSeg && ((startSeg->left - deleteLen + insertLen) == 0) && dummyHeadNodeInserted)
                {
                    Assert(start + insertLen == 0);
                    // Remove the dummy head node to preserve array consistency.
                    pArr->head = startSeg;
                    savePrev = nullptr;
                    prevSeg = &pArr->head;
                }

                while (startSeg)
                {
                    startSeg->left = startSeg->left - deleteLen + insertLen ;
                    if (startSeg->next == nullptr)
                    {
                        startSeg->EnsureSizeInBound();
                    }
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }
            }
        }

        // The size of pnewArr head allocated in above step 1 might exceed next.left concatenated in step 2/3.
        pnewArr->head->EnsureSizeInBound();
        if (savePrev)
        {
            savePrev->EnsureSizeInBound();
        }

        // insert elements
        if (insertLen > 0)
        {
            Assert(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr));

            // InsertPhase
            SparseArraySegment<T> *segInsert = nullptr;

            // see if we are just about the right of the previous segment
            Assert(!savePrev || savePrev->left <= start);
            if (savePrev && (start - savePrev->left < savePrev->size))
            {
                segInsert = (SparseArraySegment<T>*)savePrev;
                uint32 spaceLeft = segInsert->size - (start - segInsert->left);
                if(spaceLeft < insertLen)
                {
                    SparseArraySegment<T> *oldSegInsert = segInsert;
                    bool isInlineSegment = JavascriptArray::IsInlineSegment(segInsert, pArr);
                    if (!segInsert->next)
                    {
                        segInsert = segInsert->GrowByMin(recycler, insertLen - spaceLeft);
                    }
                    else
                    {
                        segInsert = segInsert->GrowByMinMax(recycler, insertLen - spaceLeft, segInsert->next->left - segInsert->left - segInsert->size);
                    }

                    if (isInlineSegment)
                    {
                        pArr->ClearElements(oldSegInsert, 0);
                    }
                }
                *prevPrevSeg = segInsert;
                segInsert->length = start + insertLen - segInsert->left;
                segInsert->CheckLengthvsSize();
            }
            else
            {
                segInsert = SparseArraySegment<T>::AllocateSegment(recycler, start, insertLen, *prevSeg);
                segInsert->next = *prevSeg;
                *prevSeg = segInsert;
                savePrev = segInsert;
            }

            uint32 relativeStart = start - segInsert->left;
            // inserted elements starts at argument 3 of splice(start, deleteNumber, insertelem1, insertelem2, insertelem3, ...);
            CopyArray(segInsert->elements + relativeStart, insertLen,
                      reinterpret_cast<const T*>(insertArgs), insertLen);
        }
    }